

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWrite.cpp
# Opt level: O2

void __thiscall stk::FileWrite::closeAifFile(FileWrite *this)

{
  StkFormat SVar1;
  long lVar2;
  long local_40;
  unsigned_long frames;
  
  frames = this->frameCounter_;
  Stk::swap32((uchar *)&frames);
  fseek((FILE *)this->fd_,0x16,0);
  fwrite(&frames,4,1,(FILE *)this->fd_);
  SVar1 = this->dataType_;
  if (SVar1 == 4) {
    lVar2 = 3;
  }
  else {
    lVar2 = 4;
    if (SVar1 != 0x10 && SVar1 != 8) {
      lVar2 = 8;
      if (SVar1 != 0x20) {
        lVar2 = (ulong)(SVar1 == 2) + 1;
      }
    }
  }
  local_40 = 0x2e;
  if (SVar1 == 0x20) {
    local_40 = 0x34;
  }
  if (SVar1 == 0x10) {
    local_40 = 0x34;
  }
  local_40 = local_40 + (ulong)this->channels_ * this->frameCounter_ * lVar2;
  Stk::swap32((uchar *)&local_40);
  fseek((FILE *)this->fd_,4,0);
  fwrite(&local_40,4,1,(FILE *)this->fd_);
  lVar2 = (ulong)this->channels_ * lVar2 * this->frameCounter_;
  local_40 = lVar2 + 8;
  if (this->dataType_ == 0x20 || this->dataType_ == 0x10) {
    local_40 = lVar2 + 0xe;
  }
  Stk::swap32((uchar *)&local_40);
  lVar2 = 0x2a;
  if (this->dataType_ == 0x20) {
    lVar2 = 0x30;
  }
  if (this->dataType_ == 0x10) {
    lVar2 = 0x30;
  }
  fseek((FILE *)this->fd_,lVar2,0);
  fwrite(&local_40,4,1,(FILE *)this->fd_);
  fclose((FILE *)this->fd_);
  return;
}

Assistant:

void FileWrite :: closeAifFile( void )
{
  unsigned long frames = (unsigned long) frameCounter_;
#ifdef __LITTLE_ENDIAN__
  swap32((unsigned char *)&frames);
#endif
  fseek(fd_, 22, SEEK_SET); // jump to "COMM" sampleFrames
  fwrite(&frames, 4, 1, fd_);

  int bytesPerSample = 1;
  if ( dataType_ == STK_SINT16 )
    bytesPerSample = 2;
  if ( dataType_ == STK_SINT24 )
    bytesPerSample = 3;
  else if ( dataType_ == STK_SINT32 || dataType_ == STK_FLOAT32 )
    bytesPerSample = 4;
  else if ( dataType_ == STK_FLOAT64 )
    bytesPerSample = 8;

  unsigned long bytes = frameCounter_ * bytesPerSample * channels_ + 46;
  if ( dataType_ == STK_FLOAT32 || dataType_ == STK_FLOAT64 ) bytes += 6;
#ifdef __LITTLE_ENDIAN__
  swap32((unsigned char *)&bytes);
#endif
  fseek(fd_, 4, SEEK_SET); // jump to file size
  fwrite(&bytes, 4, 1, fd_);

  bytes = frameCounter_ * bytesPerSample * channels_ + 8;
  if ( dataType_ == STK_FLOAT32 || dataType_ == STK_FLOAT64 ) bytes += 6;
#ifdef __LITTLE_ENDIAN__
  swap32((unsigned char *)&bytes);
#endif
  if ( dataType_ == STK_FLOAT32 || dataType_ == STK_FLOAT64 )
    fseek(fd_, 48, SEEK_SET); // jump to "SSND" chunk size
  else
    fseek(fd_, 42, SEEK_SET); // jump to "SSND" chunk size
  fwrite(&bytes, 4, 1, fd_);

  fclose( fd_ );
}